

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_s128_192_1024(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 local_98 [64];
  undefined1 local_58 [64];
  
  iVar1 = 3;
  local_58 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_98 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    iVar2 = 0x40;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      auVar5 = vpbroadcastq_avx512vl();
      for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 0x10) {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar5,
                                     *(undefined1 (*) [16])(local_98 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_98 + lVar3) = auVar6;
      }
      for (lVar3 = 0x20; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar5,
                                     *(undefined1 (*) [16])(local_98 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_98 + lVar3) = auVar6;
      }
      for (lVar3 = 0x40; lVar3 != 0x60; lVar3 = lVar3 + 0x10) {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar5,
                                     *(undefined1 (*) [16])(local_98 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_98 + lVar3) = auVar6;
      }
      for (lVar3 = 0x60; lVar3 != 0x80; lVar3 = lVar3 + 0x10) {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar5,
                                     *(undefined1 (*) [16])(local_98 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_98 + lVar3) = auVar6;
      }
      A = A + 4;
    }
  }
  c->w64[0] = local_98._0_8_;
  c->w64[1] = local_98._8_8_;
  c->w64[2] = local_98._16_8_;
  c->w64[3] = local_98._24_8_;
  c[1].w64[0] = local_98._32_8_;
  c[1].w64[1] = local_98._40_8_;
  c[1].w64[2] = local_98._48_8_;
  c[1].w64[3] = local_98._56_8_;
  c[2].w64[0] = local_58._0_8_;
  c[2].w64[1] = local_58._8_8_;
  c[2].w64[2] = local_58._16_8_;
  c[2].w64[3] = local_58._24_8_;
  c[3].w64[0] = local_58._32_8_;
  c[3].w64[1] = local_58._40_8_;
  c[3].w64[2] = local_58._48_8_;
  c[3].w64[3] = local_58._56_8_;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_192_1024(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[8] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero,
                     mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 4) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      mm128_xor_mask_region(&cval[4], Ablock[2].w64, mask, 2);
      mm128_xor_mask_region(&cval[6], Ablock[3].w64, mask, 2);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  block_t* cblock4 = BLOCK(c, 3);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
  mm128_store(&cblock3->w64[2], cval[5]);
  mm128_store(&cblock4->w64[0], cval[6]);
  mm128_store(&cblock4->w64[2], cval[7]);
}